

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::EquivScannerMixinT<4U>::Match
          (EquivScannerMixinT<4U> *this,Matcher *matcher,char16 *input,CharCount inputLength,
          CharCount *inputOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Program *pPVar4;
  uint uVar5;
  Type patLen;
  
  uVar5 = (this->super_ScannerMixin).super_LiteralMixin.offset;
  patLen = (this->super_ScannerMixin).super_LiteralMixin.length;
  pPVar4 = (matcher->program).ptr;
  if ((pPVar4->rep).insts.litbufLen - uVar5 < patLen * 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x2ae,
                       "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                       ,
                       "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pPVar4 = (matcher->program).ptr;
    uVar5 = (this->super_ScannerMixin).super_LiteralMixin.offset;
    patLen = (this->super_ScannerMixin).super_LiteralMixin.length;
  }
  bVar2 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                    (&(this->super_ScannerMixin).scanner,input,inputLength,inputOffset,
                     (pPVar4->rep).insts.litbuf.ptr + uVar5,patLen,matcher->stats);
  return bVar2;
}

Assistant:

inline bool EquivScannerMixinT<lastPatCharEquivClassSize>::Match(Matcher& matcher, const char16* const input, const CharCount inputLength, CharCount& inputOffset) const
    {
        Assert(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset);
        CompileAssert(lastPatCharEquivClassSize >= 1 && lastPatCharEquivClassSize <= CaseInsensitive::EquivClassSize);
        return scanner.Match<CaseInsensitive::EquivClassSize, lastPatCharEquivClassSize>(
            input
            , inputLength
            , inputOffset
            , matcher.program->rep.insts.litbuf + offset
            , length
#if ENABLE_REGEX_CONFIG_OPTIONS
            , matcher.stats
#endif
            );
    }